

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall json::Value::free(Value *this,void *__ptr)

{
  _Hashtable<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  ulong uStack_20;
  
  if (this->type == Object) {
    this_00 = (_Hashtable<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(this->field_1).arr;
    if (this_00 !=
        (_Hashtable<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      std::
      _Hashtable<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_00);
    }
    uStack_20 = 0x38;
  }
  else {
    if (this->type != Array) goto LAB_00b33033;
    this_00 = (_Hashtable<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(this->field_1).arr;
    if (this_00 !=
        (_Hashtable<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>::~vector
                ((vector<json::Value::Ref,_std::allocator<json::Value::Ref>_> *)this_00);
    }
    uStack_20 = 0x18;
  }
  operator_delete(this_00,uStack_20);
LAB_00b33033:
  this->type = Null;
  (this->field_1).str.str._M_len = 0;
  return;
}

Assistant:

void free() {
    if (type == Array) {
      delete arr;
      arr = nullptr;
    } else if (type == Object) {
      delete obj;
      obj = nullptr;
    }
    type = Null;
    num = 0;
  }